

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  ulong uVar1;
  LogMessage *other;
  PolyKernel *this_00;
  SigmoidKernel *this_01;
  LinearKernel *this_02;
  RBFKernel *this_03;
  undefined1 *puVar2;
  Arena *pAVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/SVM.pb.cc"
               ,0x55b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    break;
  case 2:
    if (this->_oneof_case_[0] == 2) {
      this_03 = (this->kernel_).rbfkernel_;
LAB_002bdafa:
      puVar2 = (undefined1 *)(from->kernel_).rbfkernel_;
    }
    else {
      clear_kernel(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_03 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::RBFKernel>
                          (pAVar3);
      (this->kernel_).rbfkernel_ = this_03;
      if (from->_oneof_case_[0] == 2) goto LAB_002bdafa;
      puVar2 = _RBFKernel_default_instance_;
    }
    RBFKernel::MergeFrom(this_03,(RBFKernel *)puVar2);
    goto switchD_002bd9c3_default;
  case 3:
    if (this->_oneof_case_[0] == 3) {
      this_00 = (this->kernel_).polykernel_;
LAB_002bda3f:
      puVar2 = (undefined1 *)(from->kernel_).polykernel_;
    }
    else {
      clear_kernel(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PolyKernel>
                          (pAVar3);
      (this->kernel_).polykernel_ = this_00;
      if (from->_oneof_case_[0] == 3) goto LAB_002bda3f;
      puVar2 = _PolyKernel_default_instance_;
    }
    PolyKernel::MergeFrom(this_00,(PolyKernel *)puVar2);
    goto switchD_002bd9c3_default;
  case 4:
    if (this->_oneof_case_[0] == 4) {
      this_01 = (this->kernel_).sigmoidkernel_;
LAB_002bda81:
      puVar2 = (undefined1 *)(from->kernel_).sigmoidkernel_;
    }
    else {
      clear_kernel(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar3 = *(Arena **)pAVar3;
      }
      this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SigmoidKernel>
                          (pAVar3);
      (this->kernel_).sigmoidkernel_ = this_01;
      if (from->_oneof_case_[0] == 4) goto LAB_002bda81;
      puVar2 = _SigmoidKernel_default_instance_;
    }
    SigmoidKernel::MergeFrom(this_01,(SigmoidKernel *)puVar2);
  default:
    goto switchD_002bd9c3_default;
  }
  if (this->_oneof_case_[0] == 1) {
    this_02 = (this->kernel_).linearkernel_;
LAB_002bdabf:
    puVar2 = (undefined1 *)(from->kernel_).linearkernel_;
  }
  else {
    clear_kernel(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LinearKernel>
                        (pAVar3);
    (this->kernel_).linearkernel_ = this_02;
    if (from->_oneof_case_[0] == 1) goto LAB_002bdabf;
    puVar2 = _LinearKernel_default_instance_;
  }
  LinearKernel::MergeFrom(this_02,(LinearKernel *)puVar2);
switchD_002bd9c3_default:
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      _internal_mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from._internal_linearkernel());
      break;
    }
    case kRbfKernel: {
      _internal_mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from._internal_rbfkernel());
      break;
    }
    case kPolyKernel: {
      _internal_mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from._internal_polykernel());
      break;
    }
    case kSigmoidKernel: {
      _internal_mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from._internal_sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}